

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O0

json_string * NumberToString::_itoa<int>(json_string *__return_storage_ptr__,int val)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_4d [20];
  allocator local_39;
  long local_38;
  long value;
  char *pcStack_28;
  bool negative;
  char *runner;
  char num_str_result [12];
  int val_local;
  
  num_str_result[3] = '\0';
  pcStack_28 = num_str_result + 2;
  local_38 = (long)val;
  value._7_1_ = local_38 < 0;
  if ((bool)value._7_1_) {
    local_38 = -local_38;
  }
  do {
    pcVar1 = pcStack_28;
    pcVar2 = pcStack_28 + -1;
    *pcStack_28 = (char)(local_38 % 10) + '0';
    local_38 = local_38 / 10;
    pcStack_28 = pcVar2;
  } while (local_38 != 0);
  num_str_result._4_4_ = val;
  unique0x10000127 = __return_storage_ptr__;
  if ((bool)value._7_1_) {
    *pcVar2 = '-';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _itoa(T val) json_nothrow {		
	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
	   #else
		  json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
	   #endif
	   num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
	   json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];
	   bool negative;

	   START_MEM_SCOPE
	   long value = (long)val;
	   //first thing, check if it's negative, if so, make it positive
	   if (value < 0){
		  value = -value;
		  negative = true;
	   } else {
		  negative = false;
	   }

	   //create the string
	   do {
		  *runner-- = (json_char)(value % 10) + JSON_TEXT('0');
	   } while(value /= 10);
	   END_MEM_SCOPE

	   //if it's negative, add the negation
	   if (negative){
		  *runner = JSON_TEXT('-');
		  return json_string(runner);
	   }
	   return json_string(runner + 1);
    }